

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint16_t *puVar4;
  uint8_t uVar5;
  int size;
  array_container_t *paVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int rlepos;
  long lVar12;
  
  iVar3 = c->n_runs;
  size = run_container_cardinality(c);
  iVar8 = 0x1ffe;
  if (size * 2 < 0x1ffe) {
    iVar8 = size * 2;
  }
  uVar5 = '\x03';
  if (iVar8 < iVar3 << 2) {
    if (size < 0x1001) {
      paVar6 = array_container_create_given_capacity(size);
      paVar6->cardinality = 0;
      uVar9 = 0;
      uVar7 = (ulong)(uint)c->n_runs;
      if (c->n_runs < 1) {
        uVar7 = uVar9;
      }
      for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
        uVar1 = c->runs[uVar10].value;
        uVar2 = c->runs[uVar10].length;
        puVar4 = paVar6->array;
        uVar9 = (ulong)(int)uVar9;
        for (uVar11 = (uint)uVar1; uVar11 <= (uint)uVar2 + (uint)uVar1; uVar11 = uVar11 + 1) {
          puVar4[uVar9] = (uint16_t)uVar11;
          uVar9 = uVar9 + 1;
        }
        paVar6->cardinality = (int32_t)uVar9;
      }
      uVar5 = '\x02';
      c = (run_container_t *)paVar6;
    }
    else {
      paVar6 = (array_container_t *)bitset_container_create();
      for (lVar12 = 0; lVar12 < c->n_runs; lVar12 = lVar12 + 1) {
        uVar1 = c->runs[lVar12].value;
        bitset_set_range((uint64_t *)paVar6->array,(uint)uVar1,
                         (uint)uVar1 + (uint)c->runs[lVar12].length + 1);
      }
      paVar6->cardinality = size;
      uVar5 = '\x01';
      c = (run_container_t *)paVar6;
    }
  }
  *typecode_after = uVar5;
  return (array_container_t *)c;
}

Assistant:

container_t *convert_run_to_efficient_container(
    run_container_t *c,
    uint8_t *typecode_after
){
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}